

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

void helics::zeromq::loadPoller
               (vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *poller,
               vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *sockets,
               socket_t *brokerSocket,socket_t *brokerConnection,bool serverMode,bool hasBroker)

{
  void *pvVar1;
  reference pvVar2;
  reference ppsVar3;
  socket_t *in_RCX;
  socket_t *in_RDX;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *in_RSI;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *in_RDI;
  byte in_R8B;
  byte in_R9B;
  size_type in_stack_ffffffffffffff98;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *in_stack_ffffffffffffffa0;
  
  if (((in_R8B & 1) == 0) || ((in_R9B & 1) == 0)) {
    if ((in_R8B & 1) != 0) {
      std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize
                ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::resize
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      pvVar1 = zmq::socket_t::operator_cast_to_void_(in_RDX);
      pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,0);
      pvVar2->socket = pvVar1;
      pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,0);
      pvVar2->events = 1;
      ppsVar3 = std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::operator[](in_RSI,0)
      ;
      *ppsVar3 = in_RDX;
    }
    if ((in_R9B & 1) != 0) {
      std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize
                ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::resize
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      pvVar1 = zmq::socket_t::operator_cast_to_void_(in_RCX);
      pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,0);
      pvVar2->socket = pvVar1;
      pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,0);
      pvVar2->events = 1;
      ppsVar3 = std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::operator[](in_RSI,0)
      ;
      *ppsVar3 = in_RCX;
    }
  }
  else {
    std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize
              ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::resize
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pvVar1 = zmq::socket_t::operator_cast_to_void_(in_RDX);
    pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,0);
    pvVar2->socket = pvVar1;
    pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,0);
    pvVar2->events = 1;
    ppsVar3 = std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::operator[](in_RSI,0);
    *ppsVar3 = in_RDX;
    pvVar1 = zmq::socket_t::operator_cast_to_void_(in_RCX);
    pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,1);
    pvVar2->socket = pvVar1;
    pvVar2 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](in_RDI,1);
    pvVar2->events = 1;
    ppsVar3 = std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::operator[](in_RSI,1);
    *ppsVar3 = in_RCX;
  }
  return;
}

Assistant:

static void loadPoller(std::vector<zmq::pollitem_t>& poller,
                       std::vector<zmq::socket_t*>& sockets,
                       zmq::socket_t& brokerSocket,
                       zmq::socket_t& brokerConnection,
                       bool serverMode,
                       bool hasBroker)
{
    if (serverMode && hasBroker) {
        poller.resize(2);
        sockets.resize(2);
        poller[0].socket = static_cast<void*>(brokerSocket);
        poller[0].events = ZMQ_POLLIN;
        sockets[0] = &brokerSocket;
        poller[1].socket = static_cast<void*>(brokerConnection);
        poller[1].events = ZMQ_POLLIN;
        sockets[1] = &brokerConnection;
    } else {
        if (serverMode) {
            poller.resize(1);
            sockets.resize(1);
            poller[0].socket = static_cast<void*>(brokerSocket);
            poller[0].events = ZMQ_POLLIN;
            sockets[0] = &brokerSocket;
        }
        if (hasBroker) {
            poller.resize(1);
            sockets.resize(1);
            poller[0].socket = static_cast<void*>(brokerConnection);
            poller[0].events = ZMQ_POLLIN;
            sockets[0] = &brokerConnection;
        }
    }
}